

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas_test.hpp
# Opt level: O3

int lucasTest(int n)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int k;
  ulong uVar8;
  int *__first;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined8 uStack_70;
  int aiStack_68 [2];
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_60;
  undefined1 auStack_58 [8];
  vector<int,_std::allocator<int>_> factors;
  long lVar11;
  
  if (n == 1) {
    uVar7 = 0xffffffff;
  }
  else if (n == 2) {
    uVar7 = 1;
  }
  else {
    uVar7 = 0;
    if ((n & 1U) != 0) {
      _auStack_58 = (undefined1  [16])0x0;
      factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      uStack_70 = 0x109d91;
      primeFactors(n + -1,(vector<int,_std::allocator<int>_> *)auStack_58);
      lVar6 = -((ulong)(n - 3) * 4 + 0xf & 0xfffffffffffffff0);
      __first = (int *)((long)aiStack_68 + lVar6);
      uVar8 = (ulong)(n - 2);
      if (2 < n) {
        lVar4 = uVar8 - 1;
        auVar9._8_4_ = (int)lVar4;
        auVar9._0_8_ = lVar4;
        auVar9._12_4_ = (int)((ulong)lVar4 >> 0x20);
        lVar4 = 0;
        auVar9 = auVar9 ^ _DAT_00142020;
        auVar10 = _DAT_00142010;
        do {
          auVar12 = auVar10 ^ _DAT_00142020;
          if ((bool)(~(auVar12._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar12._0_4_ ||
                      auVar9._4_4_ < auVar12._4_4_) & 1)) {
            __first[lVar4] = (int)lVar4 + 2;
          }
          if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
              auVar12._12_4_ <= auVar9._12_4_) {
            *(int *)((long)aiStack_68 + lVar4 * 4 + lVar6 + 4) = (int)lVar4 + 3;
          }
          lVar4 = lVar4 + 2;
          lVar11 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 2;
          auVar10._8_8_ = lVar11 + 2;
        } while (uVar8 + 1 != lVar4);
      }
      *(undefined8 *)((long)aiStack_68 + lVar6 + -8) = 0x109e52;
      uVar2 = time((time_t *)0x0);
      local_60._M_x = uVar2 % 0x7fffffff + (ulong)(uVar2 % 0x7fffffff == 0);
      *(undefined8 *)((long)aiStack_68 + lVar6 + -8) = 0x109ea1;
      std::shuffle<int*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                (__first,__first + (long)n + -3,&local_60);
      uVar7 = 0xffffffff;
      if (2 < n) {
        lVar6 = (long)factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start - (long)auStack_58 >> 2;
        uVar2 = 0;
        while( true ) {
          iVar1 = __first[uVar2];
          iVar3 = 2;
          iVar5 = iVar1;
          do {
            iVar5 = (iVar5 * iVar1) % n;
            iVar3 = iVar3 + 1;
          } while (n != iVar3);
          if ((iVar5 != 1) ||
             ((undefined1  [8])
              factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start == auStack_58)) break;
          lVar4 = 0;
          while( true ) {
            iVar3 = (n + -1) / *(int *)((long)auStack_58 + lVar4 * 4);
            iVar5 = iVar1;
            if (1 < iVar3) {
              iVar3 = iVar3 + -1;
              do {
                iVar5 = (iVar5 * iVar1) % n;
                iVar3 = iVar3 + -1;
              } while (iVar3 != 0);
            }
            if (iVar5 == 1) break;
            lVar4 = lVar4 + 1;
            if (lVar4 == lVar6 + (ulong)(lVar6 == 0)) {
              uVar7 = 1;
              goto LAB_00109f40;
            }
          }
          uVar2 = uVar2 + 1;
          if (uVar2 == uVar8) goto LAB_00109f40;
        }
        uVar7 = (uint)(iVar5 == 1);
      }
LAB_00109f40:
      if (auStack_58 != (undefined1  [8])0x0) {
        uStack_70 = 0x109f5c;
        operator_delete((void *)auStack_58,
                        (long)factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)auStack_58);
      }
    }
  }
  return uVar7;
}

Assistant:

inline int lucasTest(int n)
{
    // Base cases
    if (n == 1)
        return -1;
    if (n == 2)
        return 1; // Prime 
    if (n % 2 == 0)
        return 0; // Composite 

    // Generating and storing factors
    // of n-1
    std::vector<int> factors;
    primeFactors(n - 1, factors);
 
    // Array for random generator. This array
    // is to ensure one number is generated
    // only once
    int random[n - 3];
    for (int i = 0; i < n - 2; i++)
        random[i] = i + 2;
         
    // shuffle random array to produce randomness
    std::shuffle(random, random + n - 3, std::default_random_engine(time(0)));
 
    // Now one by one perform Lucas Primality
    // Test on random numbers generated.
    for (int i = 0; i < n - 2; ++i) {
        int a = random[i];
        if (power(a, n - 1, n) != 1)
            return 0; // composite
 
        // this is to check if every factor
        // of n-1 satisfy the condition
        bool flag = true;
        for (int k = 0; k < factors.size(); k++) {
            // if a^((n-1)/q) equal 1
            if (power(a, (n - 1) / factors[k], n) == 1) {
                flag = false;
                break;
            }
        }
 
        // if all condition satisfy
        if (flag)
            return 1; // prime
    }
    return -1; // probably composite
}